

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void __thiscall QScroller::setScrollerProperties(QScroller *this,QScrollerProperties *sp)

{
  bool bVar1;
  QScrollerPrivate *sp_00;
  QScrollerProperties *in_RSI;
  QScrollerPrivate *in_RDI;
  QScrollerPrivate *d;
  QScrollerProperties *in_stack_ffffffffffffffd8;
  undefined1 forceRecalc;
  QScrollerPrivate *this_00;
  
  this_00 = in_RDI;
  sp_00 = d_func((QScroller *)0xa80581);
  bVar1 = QScrollerProperties::operator!=((QScrollerProperties *)in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    QScrollerProperties::operator=(in_RSI,(QScrollerProperties *)sp_00);
    forceRecalc = (undefined1)((ulong)in_RSI >> 0x38);
    scrollerPropertiesChanged((QScroller *)in_RDI,in_stack_ffffffffffffffd8);
    QScrollerPrivate::recalcScrollingSegments(this_00,(bool)forceRecalc);
  }
  return;
}

Assistant:

void QScroller::setScrollerProperties(const QScrollerProperties &sp)
{
    Q_D(QScroller);
    if (d->properties != sp) {
        d->properties = sp;
        emit scrollerPropertiesChanged(sp);

        // we need to force the recalculation here, since the overshootPolicy may have changed and
        // existing segments may include an overshoot animation.
        d->recalcScrollingSegments(true);
    }
}